

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowbase.h
# Opt level: O3

void __thiscall
soplex::
LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::LPRowBase(LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *p_lhs,
           SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *p_rowVector,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *p_rhs,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *p_obj)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int32_t iVar4;
  
  *(undefined8 *)((this->left).m_backend.data._M_elems + 8) =
       *(undefined8 *)((p_lhs->m_backend).data._M_elems + 8);
  uVar1 = *(undefined8 *)(p_lhs->m_backend).data._M_elems;
  uVar2 = *(undefined8 *)((p_lhs->m_backend).data._M_elems + 2);
  uVar3 = *(undefined8 *)((p_lhs->m_backend).data._M_elems + 6);
  *(undefined8 *)((this->left).m_backend.data._M_elems + 4) =
       *(undefined8 *)((p_lhs->m_backend).data._M_elems + 4);
  *(undefined8 *)((this->left).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)(this->left).m_backend.data._M_elems = uVar1;
  *(undefined8 *)((this->left).m_backend.data._M_elems + 2) = uVar2;
  (this->left).m_backend.exp = (p_lhs->m_backend).exp;
  (this->left).m_backend.neg = (p_lhs->m_backend).neg;
  iVar4 = (p_lhs->m_backend).prec_elem;
  (this->left).m_backend.fpclass = (p_lhs->m_backend).fpclass;
  (this->left).m_backend.prec_elem = iVar4;
  uVar1 = *(undefined8 *)((p_rhs->m_backend).data._M_elems + 2);
  uVar2 = *(undefined8 *)((p_rhs->m_backend).data._M_elems + 4);
  uVar3 = *(undefined8 *)((p_rhs->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->right).m_backend.data._M_elems =
       *(undefined8 *)(p_rhs->m_backend).data._M_elems;
  *(undefined8 *)((this->right).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->right).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->right).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->right).m_backend.data._M_elems + 8) =
       *(undefined8 *)((p_rhs->m_backend).data._M_elems + 8);
  (this->right).m_backend.exp = (p_rhs->m_backend).exp;
  (this->right).m_backend.neg = (p_rhs->m_backend).neg;
  iVar4 = (p_rhs->m_backend).prec_elem;
  (this->right).m_backend.fpclass = (p_rhs->m_backend).fpclass;
  (this->right).m_backend.prec_elem = iVar4;
  uVar1 = *(undefined8 *)((p_obj->m_backend).data._M_elems + 2);
  uVar2 = *(undefined8 *)((p_obj->m_backend).data._M_elems + 4);
  uVar3 = *(undefined8 *)((p_obj->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->object).m_backend.data._M_elems =
       *(undefined8 *)(p_obj->m_backend).data._M_elems;
  *(undefined8 *)((this->object).m_backend.data._M_elems + 2) = uVar1;
  *(undefined8 *)((this->object).m_backend.data._M_elems + 4) = uVar2;
  *(undefined8 *)((this->object).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)((this->object).m_backend.data._M_elems + 8) =
       *(undefined8 *)((p_obj->m_backend).data._M_elems + 8);
  (this->object).m_backend.exp = (p_obj->m_backend).exp;
  (this->object).m_backend.neg = (p_obj->m_backend).neg;
  iVar4 = (p_obj->m_backend).prec_elem;
  (this->object).m_backend.fpclass = (p_obj->m_backend).fpclass;
  (this->object).m_backend.prec_elem = iVar4;
  (this->vec).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->vec).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->vec).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->vec)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a0f40;
  (this->vec).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->vec,p_rowVector->memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->vec).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,p_rowVector);
  return;
}

Assistant:

LPRowBase(const R& p_lhs, const SVectorBase<R>& p_rowVector, const R& p_rhs, const R& p_obj = 0)
      : left(p_lhs), right(p_rhs), object(p_obj), vec(p_rowVector)
   {
      assert(isConsistent());
   }